

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::uploadInputBuffer
          (BufferIoExecutor *this,void **inputPtrs,int numValues)

{
  pointer pVVar1;
  pointer pSVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *dstBasePtr;
  TestError *this_00;
  long lVar6;
  long lVar7;
  size_t inputNdx;
  ulong uVar8;
  long lVar5;
  
  iVar3 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pVVar1 = (this->m_inputLayout).
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 == (this->m_inputLayout).
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar4 = 0;
  }
  else {
    dVar4 = pVVar1->stride;
  }
  if (dVar4 * numValues != 0) {
    (**(code **)(lVar5 + 0x40))(0x90d2,(this->m_inputBuffer).super_ObjectWrapper.m_object);
    dstBasePtr = (void *)(**(code **)(lVar5 + 0xd00))(0x90d2,0,(long)(int)(dVar4 * numValues),2);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glMapBufferRange()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x40a);
    if (dstBasePtr != (void *)0x0) {
      lVar7 = 0x20;
      lVar6 = 0;
      uVar8 = 0;
      while( true ) {
        pSVar2 = (this->super_ShaderExecutor).m_inputs.
                 super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->super_ShaderExecutor).m_inputs.
                           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x38) <=
            uVar8) break;
        copyToBuffer((VarType *)((long)&(pSVar2->name)._M_dataplus._M_p + lVar7),
                     (VarLayout *)
                     ((long)&((this->m_inputLayout).
                              super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                              ._M_impl.super__Vector_impl_data._M_start)->offset + lVar6),numValues,
                     inputPtrs[uVar8],dstBasePtr);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x38;
        lVar6 = lVar6 + 0xc;
      }
      (**(code **)(lVar5 + 0x1670))(0x90d2);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glUnmapBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x41f);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"mapPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
               ,0x40b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void BufferIoExecutor::uploadInputBuffer (const void* const* inputPtrs, int numValues)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const deUint32			buffer			= *m_inputBuffer;
	const deUint32			inputStride		= getLayoutStride(m_inputLayout);
	const int				inputBufferSize	= inputStride*numValues;

	if (inputBufferSize == 0)
		return; // No inputs

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
	void* mapPtr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, inputBufferSize, GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
	TCU_CHECK(mapPtr);

	try
	{
		DE_ASSERT(m_inputs.size() == m_inputLayout.size());
		for (size_t inputNdx = 0; inputNdx < m_inputs.size(); ++inputNdx)
		{
			const glu::VarType&		varType		= m_inputs[inputNdx].varType;
			const VarLayout&		layout		= m_inputLayout[inputNdx];

			copyToBuffer(varType, layout, numValues, inputPtrs[inputNdx], mapPtr);
		}
	}
	catch (...)
	{
		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		throw;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
}